

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

SysObject ** __thiscall
r_code::vector<r_code::SysObject_*>::operator[](vector<r_code::SysObject_*> *this,size_t i)

{
  reference ppSVar1;
  
  if ((ulong)((long)(this->m_vector).
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= i) {
    std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::resize
              (&this->m_vector,i + 1);
  }
  ppSVar1 = std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::at
                      (&this->m_vector,i);
  return ppSVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }